

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsFromCalledFun
          (MemorySSATransformation *this,RWNode *phi,RWSubgraph *subg,DefSite *ds)

{
  long *plVar1;
  RWNodeCall *pRVar2;
  RWBBlock *this_00;
  RWNode *n;
  long *plVar3;
  RWNodeCall *this_01;
  _Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> local_48;
  
  plVar1 = *(long **)(subg + 0x20);
  for (plVar3 = *(long **)(subg + 0x18); plVar3 != plVar1; plVar3 = plVar3 + 1) {
    pRVar2 = (RWNodeCall *)*plVar3;
    this_01 = (RWNodeCall *)0x0;
    if ((pRVar2->super_RWNode).type == CALL) {
      this_01 = pRVar2;
    }
    this_00 = (pRVar2->super_RWNode).bblock;
    n = createPhi(this,ds,CALLIN);
    BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::insertBefore
              (&this_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>,n,
               &this_01->super_RWNode);
    RWNodeCall::addInput(this_01,n);
    RWNode::DefUses::add(&phi->defuse,n);
    findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_48,this,
                    n,ds);
    RWNode::DefUses::add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
              (&n->defuse,(vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_48
              );
    std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsFromCalledFun(RWNode *phi,
                                                           RWSubgraph *subg,
                                                           const DefSite &ds) {
    for (auto *callsite : subg->getCallers()) {
        auto *C = RWNodeCall::get(callsite);
        assert(C && "Callsite is not a call");

        auto *bblock = callsite->getBBlock();
        assert(bblock && getBBlockInfo(bblock).isCallBlock());

        // create input PHI for this call
        auto *callphi = createPhi(ds, RWNodeType::CALLIN);
        bblock->insertBefore(callphi, C);
        C->addInput(callphi);

        phi->addDefUse(callphi);
        callphi->addDefUse(findDefinitions(callphi, ds));
    }
}